

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<slang::ast::ExpressionVarVisitor&>
          (MinTypMaxExpression *this,ExpressionVarVisitor *visitor)

{
  Expression::visit<slang::ast::ExpressionVarVisitor&>(this->min_,visitor);
  Expression::visit<slang::ast::ExpressionVarVisitor&>(this->typ_,visitor);
  Expression::visit<slang::ast::ExpressionVarVisitor&>(this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }